

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::ByteSizeLong
          (CustomLayerParams_CustomLayerParamValue *this)

{
  uint32 uVar1;
  long lVar2;
  ulong uVar3;
  size_t sStack_10;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x32) {
    sStack_10 = 3;
  }
  else {
    if (uVar1 == 0x14) {
      sStack_10 = google::protobuf::internal::WireFormatLite::StringSize((string *)this->value_);
    }
    else if (uVar1 == 0x1e) {
      sStack_10 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                            ((this->value_).intvalue_);
    }
    else {
      if (uVar1 != 0x28) {
        if (uVar1 == 10) {
          sStack_10 = 9;
        }
        else {
          sStack_10 = 0;
        }
        goto LAB_001c05d9;
      }
      uVar3 = (this->value_).longvalue_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sStack_10 = (size_t)((int)lVar2 * 9 + 0x49U >> 6);
    }
    sStack_10 = sStack_10 + 2;
  }
LAB_001c05d9:
  this->_cached_size_ = (int)sStack_10;
  return sStack_10;
}

Assistant:

size_t CustomLayerParams_CustomLayerParamValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  size_t total_size = 0;

  switch (value_case()) {
    // double doubleValue = 10;
    case kDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // string stringValue = 20;
    case kStringValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->stringvalue());
      break;
    }
    // int32 intValue = 30;
    case kIntValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->intvalue());
      break;
    }
    // int64 longValue = 40;
    case kLongValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->longvalue());
      break;
    }
    // bool boolValue = 50;
    case kBoolValue: {
      total_size += 2 + 1;
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}